

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotation.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorRotation::SetSpindleConstraint
          (ChLinkMotorRotation *this,bool mc_x,bool mc_y,bool mc_z,bool mc_rx,bool mc_ry)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  
  auVar2 = vpbroadcastb_avx512vl(ZEXT116(1));
  uVar1 = (ushort)(byte)(mc_x * auVar2[0]);
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_x = (bool)(char)uVar1;
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_y = (bool)(char)(uVar1 >> 8);
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_z =
       (bool)(-(char)((short)((ushort)mc_z << 0xf) >> 0xf) * auVar2[2]);
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_rx = (bool)(mc_rx * auVar2[3]);
  (this->super_ChLinkMotor).super_ChLinkMateGeneric.c_ry = mc_ry;
  ChLinkMateGeneric::SetupLinkMask((ChLinkMateGeneric *)this);
  return;
}

Assistant:

void ChLinkMotorRotation::SetSpindleConstraint(bool mc_x, bool mc_y, bool mc_z, bool mc_rx, bool mc_ry) {
    this->c_x = mc_x;
    this->c_y = mc_y;
    this->c_z = mc_z;
    this->c_rx = mc_rx;
    this->c_ry = mc_ry;
    SetupLinkMask();
}